

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JointPolicyDiscretePure.cpp
# Opt level: O1

JointPolicyDiscretePure * __thiscall
JointPolicyDiscretePure::operator=(JointPolicyDiscretePure *this,JointPolicyDiscretePure *o)

{
  if (this != o) {
    JointPolicyDiscrete::operator=(&this->super_JointPolicyDiscrete,&o->super_JointPolicyDiscrete);
  }
  return this;
}

Assistant:

JointPolicyDiscretePure& JointPolicyDiscretePure::operator= (const JointPolicyDiscretePure& o)
{
#if DEBUG_JPOLASSIGN 
    cerr << "JointPolicyDiscretePure::operator=(const JointPolicyDiscretePure& jp) called"<<endl;
#endif
    if (this == &o) return *this;   // Gracefully handle self assignment
    JointPolicyDiscrete::operator= ( o );   //call parent
  // Put the normal assignment duties here...

    return *this;
}